

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::FindFileByName
          (SourceTreeDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  DescriptorDatabase *pDVar1;
  MultiFileErrorCollector *pMVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  SingleFileErrorCollector file_error_collector;
  Parser parser;
  Tokenizer tokenizer;
  ZeroCopyInputStream *input;
  
  iVar4 = (*this->source_tree_->_vptr_SourceTree[2])();
  input = (ZeroCopyInputStream *)CONCAT44(extraout_var,iVar4);
  if (input == (ZeroCopyInputStream *)0x0) {
    pDVar1 = this->fallback_database_;
    if ((pDVar1 != (DescriptorDatabase *)0x0) &&
       (iVar4 = (*pDVar1->_vptr_DescriptorDatabase[2])(pDVar1,filename,output), (char)iVar4 != '\0')
       ) {
      return true;
    }
    pMVar2 = this->error_collector_;
    if (pMVar2 != (MultiFileErrorCollector *)0x0) {
      (*this->source_tree_->_vptr_SourceTree[3])(&tokenizer);
      (*pMVar2->_vptr_MultiFileErrorCollector[2])(pMVar2,filename,0xffffffffffffffff,0,&tokenizer);
      std::__cxx11::string::~string((string *)&tokenizer);
    }
    bVar3 = false;
  }
  else {
    SingleFileErrorCollector::SingleFileErrorCollector
              (&file_error_collector,filename,this->error_collector_);
    io::Tokenizer::Tokenizer(&tokenizer,input,&file_error_collector.super_ErrorCollector);
    Parser::Parser(&parser);
    if (this->error_collector_ != (MultiFileErrorCollector *)0x0) {
      parser.error_collector_ = &file_error_collector.super_ErrorCollector;
    }
    if (this->using_validation_error_collector_ == true) {
      parser.source_location_table_ = &this->source_locations_;
    }
    FileDescriptorProto::_internal_set_name(output,filename);
    bVar3 = Parser::Parse(&parser,&tokenizer,output);
    bVar3 = (bool)(bVar3 & (file_error_collector.had_errors_ ^ 1U));
    Parser::~Parser(&parser);
    io::Tokenizer::~Tokenizer(&tokenizer);
    SingleFileErrorCollector::~SingleFileErrorCollector(&file_error_collector);
    (*input->_vptr_ZeroCopyInputStream[1])(input);
  }
  return bVar3;
}

Assistant:

bool SourceTreeDescriptorDatabase::FindFileByName(const std::string& filename,
                                                  FileDescriptorProto* output) {
  std::unique_ptr<io::ZeroCopyInputStream> input(source_tree_->Open(filename));
  if (input == NULL) {
    if (fallback_database_ != nullptr &&
        fallback_database_->FindFileByName(filename, output)) {
      return true;
    }
    if (error_collector_ != NULL) {
      error_collector_->AddError(filename, -1, 0,
                                 source_tree_->GetLastErrorMessage());
    }
    return false;
  }

  // Set up the tokenizer and parser.
  SingleFileErrorCollector file_error_collector(filename, error_collector_);
  io::Tokenizer tokenizer(input.get(), &file_error_collector);

  Parser parser;
  if (error_collector_ != NULL) {
    parser.RecordErrorsTo(&file_error_collector);
  }
  if (using_validation_error_collector_) {
    parser.RecordSourceLocationsTo(&source_locations_);
  }

  // Parse it.
  output->set_name(filename);
  return parser.Parse(&tokenizer, output) && !file_error_collector.had_errors();
}